

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  
  uVar4 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
  }
  uVar5 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  if (uVar4 != uVar5) {
    return;
  }
  bVar1 = IsInlinedStringDonated(this,lhs,field);
  bVar2 = IsInlinedStringDonated(this,rhs,field);
  if (bVar1 == bVar2) {
    return;
  }
  if ((this->schema_).inlined_string_donated_offset_ == -1) {
    SwapInlinedStringDonated();
LAB_0027e6a7:
    SwapInlinedStringDonated();
LAB_0027e6b1:
    SwapInlinedStringDonated();
  }
  else {
    this_00 = &this->schema_;
    uVar3 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_0027e6a7;
    puVar8 = (uint *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    uVar3 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    if ((*puVar8 & 1) != 0) goto LAB_0027e6b1;
    puVar7 = (uint *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    if ((*puVar7 & 1) == 0) {
      uVar3 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
      if (uVar3 != 0) {
        uVar6 = 1 << ((byte)uVar3 & 0x1f);
        if (bVar2) {
          puVar8[uVar3 >> 5] = puVar8[uVar3 >> 5] | uVar6;
          puVar7[uVar3 >> 5] = puVar7[uVar3 >> 5] & ~uVar6;
          return;
        }
        puVar8[uVar3 >> 5] = puVar8[uVar3 >> 5] & ~uVar6;
        puVar7[uVar3 >> 5] = puVar7[uVar3 >> 5] | uVar6;
        return;
      }
      goto LAB_0027e6c8;
    }
  }
  SwapInlinedStringDonated();
LAB_0027e6c8:
  SwapInlinedStringDonated();
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}